

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detector.cpp
# Opt level: O0

void __thiscall Semantic::Detector::detect(Detector *this)

{
  SymbolTable *this_00;
  bool bVar1;
  bool bVar2;
  reference ppVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
  *c;
  iterator __end2;
  iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
  *__range2;
  bool containsCircularDependency;
  UndeclaredClass *undeclaredClass;
  Detector *this_local;
  
  initDependencyGraph(this,this->symbolTable);
  bVar1 = detectCircularDependency(this);
  if (!bVar1) {
    this_00 = this->symbolTable;
    __end2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
             ::begin(&this_00->classes);
    c = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>
         *)std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>_>_>
           ::end(&this_00->classes);
    while (bVar2 = std::__detail::operator!=
                             (&__end2.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_true>
                              ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_true>
                                *)&c), bVar2) {
      ppVar3 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_false,_true>
               ::operator*(&__end2);
      detectShadowMembers(this,ppVar3->second);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Class_*>,_false,_true>
      ::operator++(&__end2);
    }
  }
  if (!bVar1) {
    calculateMemSize(this,this->symbolTable);
  }
  detectUndefinedClassFunctions(this);
  detectFreeFunctionsErrors(this);
  detectClassFunctionsErrors(this);
  return;
}

Assistant:

void Semantic::Detector::detect() {
    //If an undeclared class found while building the dependency graph, the detect function returns
    //and will not proceed with other detections.
    try { initDependencyGraph(symbolTable); }
    catch (Semantic::Err::UndeclaredClass &undeclaredClass) {
        addError(undeclaredClass.what());
        return;
    }

    bool containsCircularDependency = detectCircularDependency();

    //If contains circular dependency, shadow member function gets stuck in an infinite loop.
    if (!containsCircularDependency) {
        for (const auto &c : symbolTable->classes) {
            detectShadowMembers(c.second);
        }
    }

    if (!containsCircularDependency) calculateMemSize(symbolTable);

    detectUndefinedClassFunctions();
    detectFreeFunctionsErrors();
    detectClassFunctionsErrors();
}